

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O2

void __thiscall hdc::ForStatement::~ForStatement(ForStatement *this)

{
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019b030;
  if (this->e1 != (Expression *)0x0) {
    (*(this->e1->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  if (this->e2 != (Expression *)0x0) {
    (*(this->e2->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  if (this->e3 != (Expression *)0x0) {
    (*(this->e3->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  if (this->statements != (CompoundStatement *)0x0) {
    (*(this->statements->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  ASTNode::setKind((ASTNode *)this,AST_FOR);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

ForStatement::~ForStatement() {
    delete e1;
    delete e2;
    delete e3;
    delete statements;
    setKind(AST_FOR);
}